

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * Catch::runTests(Totals *__return_storage_ptr__,Ptr<Catch::Config> *config)

{
  pointer pPVar1;
  size_t sVar2;
  pointer pFVar3;
  Ptr<Catch::IStreamingReporter> PVar4;
  int iVar5;
  undefined4 extraout_var;
  TestSpecParser *this;
  IRegistryHub *pIVar6;
  undefined4 extraout_var_00;
  long *plVar7;
  undefined1 auVar8 [8];
  TestCase *testCase;
  pointer pPVar9;
  undefined1 local_388 [8];
  RunContext context;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_158;
  string local_138;
  undefined1 local_118 [32];
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  local_e0;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_c8;
  TagAliasRegistry *local_b0;
  TestCase *local_a8;
  IStreamingReporter *local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  pointer local_70;
  undefined1 auStack_68 [8];
  TestSpec testSpec;
  Ptr<Catch::IStreamingReporter> local_40;
  Ptr<Catch::IStreamingReporter> reporter;
  Ptr<const_Catch::IConfig> iconfig;
  
  reporter.m_p = (IStreamingReporter *)config->m_p;
  if ((Config *)reporter.m_p != (Config *)0x0) {
    (*(((Config *)reporter.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  makeReporter((Catch *)&local_40,config);
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_40.m_p;
  if ((pointer)local_40.m_p != (pointer)0x0) {
    (*(code *)(((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                 *)&(local_40.m_p)->super_IShared)->
              super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].m_p)();
  }
  addListeners((Catch *)local_388,(Ptr<const_Catch::IConfig> *)&reporter,
               (Ptr<Catch::IStreamingReporter> *)
               &testSpec.m_filters.
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Ptr<Catch::IStreamingReporter>::operator=(&local_40,(Ptr<Catch::IStreamingReporter> *)local_388);
  if (local_388 != (undefined1  [8])0x0) {
    (**(code **)((long)*(IShared *)local_388 + 0x18))();
  }
  if (testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)((testSpec.m_filters.
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
              super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].m_p)();
  }
  RunContext::RunContext((RunContext *)local_388,(Ptr<const_Catch::IConfig> *)&reporter,&local_40);
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])(local_118);
  RunContext::testGroupStarting((RunContext *)local_388,(string *)local_118,1,1);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  iVar5 = (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)auStack_68
             ,(vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
              CONCAT44(extraout_var,iVar5));
  if (auStack_68 ==
      (undefined1  [8])
      testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start) {
    TagAliasRegistry::get();
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_e0.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_c8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_c8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_c8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0 = &TagAliasRegistry::get::instance;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_118._24_8_ = &local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"~[.]","");
    this = TestSpecParser::parse((TestSpecParser *)local_118,&local_138);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_158,&(this->m_testSpec).m_filters);
    context.m_trackerContext._16_8_ = auStack_68;
    auStack_68 = (undefined1  [8])
                 local_158.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_158.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_158.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &context.m_trackerContext.m_runState);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_c8);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._24_8_ != &local_f0) {
      operator_delete((void *)local_118._24_8_,
                      CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1);
    }
  }
  PVar4.m_p = reporter.m_p;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  plVar7 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x18))
                             ((long *)CONCAT44(extraout_var_00,iVar5),PVar4.m_p);
  testCase = (TestCase *)*plVar7;
  local_a8 = (TestCase *)plVar7[1];
  if (testCase != local_a8) {
    local_98 = 0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    local_78 = 0;
    local_70 = (pointer)0x0;
    do {
      sVar2 = context.m_totals.assertions.passed;
      iVar5 = (**(code **)(*(long *)context.m_lastResult.m_resultData._64_8_ + 0x50))();
      pFVar3 = testSpec.m_filters.
               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((sVar2 != (long)iVar5) &&
         (auStack_68 !=
          (undefined1  [8])
          testSpec.m_filters.
          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
          _M_impl.super__Vector_impl_data._M_start)) {
        local_a0 = reporter.m_p;
        auVar8 = auStack_68;
        do {
          pPVar9 = (((pointer)auVar8)->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar1 = (((pointer)auVar8)->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (pPVar9 == pPVar1) {
              iVar5 = (*(local_a0->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
              if (((char)iVar5 == '\0') &&
                 (((testCase->super_TestCaseInfo).properties & Throws) != None)) goto LAB_0012d83e;
              RunContext::runTest((Totals *)local_118,(RunContext *)local_388,testCase);
              local_70 = local_70 + local_118._0_8_;
              (__return_storage_ptr__->assertions).passed = (size_t)local_70;
              local_78 = local_78 + local_118._8_8_;
              (__return_storage_ptr__->assertions).failed = local_78;
              local_80 = local_80 + local_118._16_8_;
              local_88 = local_88 + local_118._24_8_;
              (__return_storage_ptr__->assertions).failedButOk = local_80;
              (__return_storage_ptr__->testCases).passed = local_88;
              local_90 = local_90 + local_f8;
              (__return_storage_ptr__->testCases).failed = local_90;
              local_98 = local_98 +
                         CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]);
              (__return_storage_ptr__->testCases).failedButOk = local_98;
              goto LAB_0012d84e;
            }
            iVar5 = (*(pPVar9->m_p->super_SharedImpl<Catch::IShared>).super_IShared.
                      super_NonCopyable._vptr_NonCopyable[4])(pPVar9->m_p,testCase);
            if ((char)iVar5 == '\0') break;
            pPVar9 = pPVar9 + 1;
          }
          auVar8 = (undefined1  [8])((long)auVar8 + 0x18);
        } while (auVar8 != (undefined1  [8])pFVar3);
      }
LAB_0012d83e:
      (*(code *)(((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   *)&(local_40.m_p)->super_IShared)->
                super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_start[0x10].m_p)(local_40.m_p,testCase);
LAB_0012d84e:
      testCase = testCase + 1;
    } while (testCase != local_a8);
  }
  (*((reporter.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_118);
  RunContext::testGroupEnded((RunContext *)local_388,(string *)local_118,__return_storage_ptr__,1,1)
  ;
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)auStack_68
            );
  RunContext::~RunContext((RunContext *)local_388);
  if ((pointer)local_40.m_p != (pointer)0x0) {
    (*(code *)(((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                 *)&(local_40.m_p)->super_IShared)->
              super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
              )._M_impl.super__Vector_impl_data._M_start[3].m_p)();
  }
  if (reporter.m_p != (IStreamingReporter *)0x0) {
    (*((reporter.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }